

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::verify_message_impl
          (dht *this,bdecode_node *message,span<const_libtorrent::dht::key_desc_t> desc,
          span<libtorrent::bdecode_node> ret,span<char> error)

{
  bool bVar1;
  type_t tVar2;
  int iVar3;
  bdecode_node *pbVar4;
  char *pcVar5;
  size_t sVar6;
  key_desc_t *pkVar7;
  bdecode_node *local_318;
  bdecode_node *local_260;
  undefined1 auStack_240 [7];
  bool invalid;
  bdecode_node local_230;
  key_desc_t *local_1f0;
  key_desc_t *k;
  undefined4 local_1e0;
  int i_1;
  undefined1 local_1d8 [4];
  int stack_ptr;
  bdecode_node stack [5];
  int local_84;
  undefined1 local_80 [4];
  int i;
  bdecode_node msg;
  index_type size;
  bdecode_node *message_local;
  span<libtorrent::bdecode_node> ret_local;
  span<const_libtorrent::dht::key_desc_t> desc_local;
  
  ret_local.m_ptr = ret.m_ptr;
  message_local = (bdecode_node *)desc.m_len;
  ret_local.m_len = (difference_type)message;
  msg._56_8_ = span<libtorrent::bdecode_node>::size
                         ((span<libtorrent::bdecode_node> *)&message_local);
  bdecode_node::non_owning((bdecode_node *)local_80,(bdecode_node *)this);
  for (local_84 = 0; (long)local_84 < (long)msg._56_8_; local_84 = local_84 + 1) {
    pbVar4 = span<libtorrent::bdecode_node>::operator[]
                       ((span<libtorrent::bdecode_node> *)&message_local,(long)local_84);
    bdecode_node::clear(pbVar4);
  }
  local_260 = (bdecode_node *)local_1d8;
  do {
    bdecode_node::bdecode_node(local_260);
    local_260 = local_260 + 1;
  } while (local_260 != (bdecode_node *)&stack[4].m_size);
  i_1 = -1;
  tVar2 = bdecode_node::type((bdecode_node *)local_80);
  if (tVar2 == dict_t) {
    i_1 = i_1 + 1;
    bdecode_node::operator=((bdecode_node *)(local_1d8 + (long)i_1 * 0x40),(bdecode_node *)local_80)
    ;
    for (k._4_4_ = 0; (long)k._4_4_ < (long)msg._56_8_; k._4_4_ = k._4_4_ + 1) {
      local_1f0 = span<const_libtorrent::dht::key_desc_t>::operator[]
                            ((span<const_libtorrent::dht::key_desc_t> *)&ret_local.m_len,
                             (long)k._4_4_);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_240,local_1f0->name);
      bdecode_node::dict_find(&local_230,(bdecode_node *)local_80,_auStack_240);
      pbVar4 = span<libtorrent::bdecode_node>::operator[]
                         ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
      bdecode_node::operator=(pbVar4,&local_230);
      bdecode_node::~bdecode_node(&local_230);
      pbVar4 = span<libtorrent::bdecode_node>::operator[]
                         ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
      bVar1 = bdecode_node::operator_cast_to_bool(pbVar4);
      if (bVar1) {
        pbVar4 = span<libtorrent::bdecode_node>::operator[]
                           ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
        tVar2 = bdecode_node::type(pbVar4);
        if ((tVar2 != local_1f0->type) && (local_1f0->type != 0)) {
          pbVar4 = span<libtorrent::bdecode_node>::operator[]
                             ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
          bdecode_node::clear(pbVar4);
        }
      }
      pbVar4 = span<libtorrent::bdecode_node>::operator[]
                         ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
      bVar1 = bdecode_node::operator_cast_to_bool(pbVar4);
      if ((!bVar1) && ((local_1f0->flags & 1U) == 0)) {
        pcVar5 = span<char>::data(&error);
        sVar6 = span<char>::size(&error);
        snprintf(pcVar5,sVar6,"missing \'%s\' key",local_1f0->name);
        desc_local.m_len._7_1_ = false;
        goto LAB_008109ac;
      }
      if (0 < local_1f0->size) {
        pbVar4 = span<libtorrent::bdecode_node>::operator[]
                           ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
        bVar1 = bdecode_node::operator_cast_to_bool(pbVar4);
        if ((bVar1) && (local_1f0->type == 3)) {
          if ((local_1f0->flags & 8U) == 0) {
            pbVar4 = span<libtorrent::bdecode_node>::operator[]
                               ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
            iVar3 = bdecode_node::string_length(pbVar4);
            bVar1 = iVar3 != local_1f0->size;
          }
          else {
            pbVar4 = span<libtorrent::bdecode_node>::operator[]
                               ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
            iVar3 = bdecode_node::string_length(pbVar4);
            bVar1 = iVar3 % local_1f0->size != 0;
          }
          if (bVar1) {
            pbVar4 = span<libtorrent::bdecode_node>::operator[]
                               ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
            bdecode_node::clear(pbVar4);
            if ((local_1f0->flags & 1U) == 0) {
              pcVar5 = span<char>::data(&error);
              sVar6 = span<char>::size(&error);
              snprintf(pcVar5,sVar6,"invalid value for \'%s\'",local_1f0->name);
              desc_local.m_len._7_1_ = false;
              goto LAB_008109ac;
            }
          }
        }
      }
      if ((local_1f0->flags & 2U) == 0) {
        if ((local_1f0->flags & 4U) != 0) {
          if (i_1 == 0) {
            desc_local.m_len._7_1_ = false;
            goto LAB_008109ac;
          }
          i_1 = i_1 + -1;
          bdecode_node::operator=
                    ((bdecode_node *)local_80,(bdecode_node *)(local_1d8 + (long)i_1 * 0x40));
        }
      }
      else {
        pbVar4 = span<libtorrent::bdecode_node>::operator[]
                           ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
        bVar1 = bdecode_node::operator_cast_to_bool(pbVar4);
        if (bVar1) {
          i_1 = i_1 + 1;
          pbVar4 = span<libtorrent::bdecode_node>::operator[]
                             ((span<libtorrent::bdecode_node> *)&message_local,(long)k._4_4_);
          bdecode_node::operator=((bdecode_node *)local_80,pbVar4);
          bdecode_node::operator=
                    ((bdecode_node *)(local_1d8 + (long)i_1 * 0x40),(bdecode_node *)local_80);
        }
        else {
          while( true ) {
            bVar1 = false;
            if ((long)k._4_4_ < (long)msg._56_8_) {
              pkVar7 = span<const_libtorrent::dht::key_desc_t>::operator[]
                                 ((span<const_libtorrent::dht::key_desc_t> *)&ret_local.m_len,
                                  (long)k._4_4_);
              bVar1 = (pkVar7->flags & 4U) == 0;
            }
            if (!bVar1) break;
            k._4_4_ = k._4_4_ + 1;
          }
        }
      }
    }
    desc_local.m_len._7_1_ = true;
  }
  else {
    pcVar5 = span<char>::data(&error);
    sVar6 = span<char>::size(&error);
    snprintf(pcVar5,sVar6,"not a dictionary");
    desc_local.m_len._7_1_ = false;
  }
LAB_008109ac:
  local_1e0 = 1;
  local_318 = (bdecode_node *)&stack[4].m_size;
  do {
    local_318 = local_318 + -1;
    bdecode_node::~bdecode_node(local_318);
  } while (local_318 != (bdecode_node *)local_1d8);
  bdecode_node::~bdecode_node((bdecode_node *)local_80);
  return desc_local.m_len._7_1_;
}

Assistant:

bool verify_message_impl(bdecode_node const& message, span<key_desc_t const> desc
	, span<bdecode_node> ret, span<char> error)
{
	TORRENT_ASSERT(desc.size() == ret.size());

	auto const size = ret.size();

	// get a non-root bdecode_node that still
	// points to the root. message should not be copied
	bdecode_node msg = message.non_owning();

	// clear the return buffer
	for (int i = 0; i < size; ++i)
		ret[i].clear();

	// when parsing child nodes, this is the stack
	// of bdecode_nodes to return to
	bdecode_node stack[5];
	int stack_ptr = -1;

	if (msg.type() != bdecode_node::dict_t)
	{
		std::snprintf(error.data(), static_cast<std::size_t>(error.size()), "not a dictionary");
		return false;
	}
	++stack_ptr;
	stack[stack_ptr] = msg;
	for (int i = 0; i < size; ++i)
	{
		key_desc_t const& k = desc[i];

		//		std::fprintf(stderr, "looking for %s in %s\n", k.name, print_entry(*msg).c_str());

		ret[i] = msg.dict_find(k.name);
		// none_t means any type
		if (ret[i] && ret[i].type() != k.type && k.type != bdecode_node::none_t)
			ret[i].clear();
		if (!ret[i] && (k.flags & key_desc_t::optional) == 0)
		{
			// the key was not found, and it's not an optional key
			std::snprintf(error.data(), static_cast<std::size_t>(error.size()), "missing '%s' key", k.name);
			return false;
		}

		if (k.size > 0
			&& ret[i]
			&& k.type == bdecode_node::string_t)
		{
			bool const invalid = (k.flags & key_desc_t::size_divisible)
				? (ret[i].string_length() % k.size) != 0
				: ret[i].string_length() != k.size;

			if (invalid)
			{
				// the string was not of the required size
				ret[i].clear();
				if ((k.flags & key_desc_t::optional) == 0)
				{
					std::snprintf(error.data(), static_cast<std::size_t>(error.size())
						, "invalid value for '%s'", k.name);
					return false;
				}
			}
		}
		if (k.flags & key_desc_t::parse_children)
		{
			TORRENT_ASSERT(k.type == bdecode_node::dict_t);

			if (ret[i])
			{
				++stack_ptr;
				TORRENT_ASSERT(stack_ptr < int(sizeof(stack) / sizeof(stack[0])));
				msg = ret[i];
				stack[stack_ptr] = msg;
			}
			else
			{
				// skip all children
				while (i < size && (desc[i].flags & key_desc_t::last_child) == 0) ++i;
				// if this assert is hit, desc is incorrect
				TORRENT_ASSERT(i < size);
			}
		}
		else if (k.flags & key_desc_t::last_child)
		{
			TORRENT_ASSERT(stack_ptr > 0);
			// this can happen if the specification passed
			// in is unbalanced. i.e. contain more last_child
			// nodes than parse_children
			if (stack_ptr == 0) return false;
			--stack_ptr;
			msg = stack[stack_ptr];
		}
	}
	return true;
}